

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O2

MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
* __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::createSingleShaderProgram
          (MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
           *__return_storage_ptr__,SeparateShaderTest *this,ShaderType shaderType,string *src)

{
  ostringstream *this_00;
  deUint32 type;
  GLuint program;
  GLenum GVar1;
  qpShaderType type_00;
  ProgramWrapper *pPVar2;
  TestError *pTVar3;
  TestLog *this_01;
  GLchar **strings;
  string *frgSource;
  size_t __n;
  void *__buf;
  void *__buf_00;
  allocator<char> local_282;
  allocator<char> local_281;
  string *local_280;
  RenderContext *local_278;
  string local_270;
  string local_250 [32];
  char *srcStr;
  LogShader local_228;
  undefined1 local_1d8 [40];
  undefined1 local_1b0 [384];
  
  if ((this->m_params).useCreateHelper == true) {
    local_278 = ((this->super_TestCase).m_context)->m_renderCtx;
    srcStr = (src->_M_dataplus)._M_p;
    strings = &srcStr;
    local_280 = src;
    type = glu::getGLShaderType(shaderType);
    program = glu::CallLogWrapper::glCreateShaderProgramv
                        (&this->super_CallLogWrapper,type,1,strings);
    GVar1 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
    if ((program == 0) || (GVar1 != 0)) {
      type_00 = glu::getLogShaderType(shaderType);
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"glCreateShaderProgramv() failed");
      this_01 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                (local_250,"[glCreateShaderProgramv() failed]",&local_281);
      local_1d8[0] = false;
      std::__cxx11::string::string((string *)(local_1d8 + 8),local_250);
      tcu::LogShaderProgram::write((LogShaderProgram *)local_1d8,(int)this_01,__buf,(size_t)strings)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,"[glCreateShaderProgramv() failed]",&local_282);
      __n = 0;
      tcu::LogShader::LogShader(&local_228,type_00,local_280,false,&local_270);
      tcu::LogShader::write(&local_228,(int)this_01,__buf_00,__n);
      tcu::TestLog::endShaderProgram(this_01);
      tcu::LogShader::~LogShader(&local_228);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)(local_1d8 + 8));
      std::__cxx11::string::~string(local_250);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"glCreateShaderProgramv() failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSeparateShaderTests.cpp"
                 ,0x46f);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    pPVar2 = (ProgramWrapper *)operator_new(0x70);
    pPVar2->_vptr_ProgramWrapper = (_func_int **)&PTR__RawProgramWrapper_01e52ce0;
    glu::Program::Program((Program *)(pPVar2 + 1),local_278,program);
    *(ShaderType *)&pPVar2[9]._vptr_ProgramWrapper = shaderType;
    std::__cxx11::string::string((string *)(pPVar2 + 10),(string *)local_280);
    (__return_storage_ptr__->
    super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
    ).m_data.ptr = pPVar2;
    if (*(char *)&pPVar2[7]._vptr_ProgramWrapper == '\0') {
      tcu::TestLog::writeMessage
                (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                 "glCreateShaderProgramv() failed at linking");
      (*pPVar2->_vptr_ProgramWrapper[3])
                (pPVar2,((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"glCreateShaderProgram() failed at linking",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSeparateShaderTests.cpp"
                 ,0x47b);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  else {
    if (shaderType == SHADERTYPE_VERTEX) {
      frgSource = (string *)0x0;
    }
    else {
      frgSource = src;
      src = (string *)0x0;
    }
    createShaderProgram(__return_storage_ptr__,this,src,frgSource,true);
  }
  return __return_storage_ptr__;
}

Assistant:

MovePtr<ProgramWrapper> SeparateShaderTest::createSingleShaderProgram (ShaderType shaderType,
																	   const string& src)
{
	const RenderContext&	renderCtx	= getRenderContext();

	if (m_params.useCreateHelper)
	{
		const char*	const	srcStr		= src.c_str();
		const GLenum		glType		= glu::getGLShaderType(shaderType);
		const GLuint		programName	= glCreateShaderProgramv(glType, 1, &srcStr);

		if (glGetError() != GL_NO_ERROR || programName == 0)
		{
			qpShaderType qpType = glu::getLogShaderType(shaderType);

			log() << TestLog::Message << "glCreateShaderProgramv() failed"
				  << TestLog::EndMessage
				  << TestLog::ShaderProgram(false, "[glCreateShaderProgramv() failed]")
				  << TestLog::Shader(qpType, src,
									 false, "[glCreateShaderProgramv() failed]")
				  << TestLog::EndShaderProgram;
			TCU_FAIL("glCreateShaderProgramv() failed");
		}

		RawProgramWrapper* const	wrapper	= new RawProgramWrapper(renderCtx, programName,
																	shaderType, src);
		MovePtr<ProgramWrapper>		wrapperPtr(wrapper);
		Program&					program = wrapper->getProgram();

		if (!program.getLinkStatus())
		{
			log().writeMessage("glCreateShaderProgramv() failed at linking");
			wrapper->writeToLog(log());
			TCU_FAIL("glCreateShaderProgram() failed at linking");
		}
		return wrapperPtr;
	}
	else
	{
		switch (shaderType)
		{
			case glu::SHADERTYPE_VERTEX:
				return createShaderProgram(&src, DE_NULL, true);
			case glu::SHADERTYPE_FRAGMENT:
				return createShaderProgram(DE_NULL, &src, true);
			default:
				DE_FATAL("Impossible case");
		}
	}
	return MovePtr<ProgramWrapper>(); // Shut up compiler warnings.
}